

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  char cVar2;
  bool bVar3;
  TargetType TVar4;
  char *pcVar5;
  pointer ppcVar6;
  pointer this_01;
  undefined7 in_register_00000089;
  allocator local_13e;
  allocator local_13d;
  undefined4 local_13c;
  cmLocalUnixMakefileGenerator3 *local_138;
  char *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string makeTarget;
  string local_50;
  
  local_13c = (undefined4)CONCAT71(in_register_00000089,check_relink);
  local_138 = lg;
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)lg);
  std::__cxx11::string::string((string *)&makeTarget,pcVar5,(allocator *)&doc);
  std::__cxx11::string::append((char *)&makeTarget);
  std::__cxx11::string::append((char *)&makeTarget);
  pcVar1 = local_138;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = pass;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(local_138->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       GeneratorTargets);
  cVar2 = (char)local_13c;
  ppcVar6 = targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar6 ==
        targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&doc,(cmLocalGenerator *)local_138);
      cmStateSnapshot::GetChildren(&children,(cmStateSnapshot *)&doc);
      for (this_01 = children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          this_01 !=
          children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
          super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&doc,this_01);
        pcVar5 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&doc);
        std::__cxx11::string::string((string *)&no_commands,pcVar5,&local_13e);
        std::__cxx11::string::append((char *)&no_commands);
        std::__cxx11::string::append((char *)&no_commands);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,(value_type *)&no_commands);
        std::__cxx11::string::~string((string *)&no_commands);
      }
      if (depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = std::operator!=(&this->EmptyRuleHackDepends,"");
        if (bVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&this->EmptyRuleHackDepends);
        }
      }
      std::__cxx11::string::string
                ((string *)&doc,"Convenience name for \"",(allocator *)&no_commands);
      std::__cxx11::string::append((char *)&doc);
      std::__cxx11::string::append((char *)&doc);
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_138,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,&no_commands,
                 true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_commands);
      std::__cxx11::string::~string((string *)&doc);
      std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
                (&children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>);
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&makeTarget);
      return;
    }
    this_00 = *ppcVar6;
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (TVar4 < GLOBAL_TARGET) {
      if (check_all) {
        std::__cxx11::string::string((string *)&local_50,"EXCLUDE_FROM_ALL",&local_13d);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
        if (bVar3 || cVar2 != '\x01') {
          bVar3 = !bVar3;
LAB_0040b62a:
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
LAB_0040b615:
          bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall
                            (this_00,&(pcVar1->super_cmLocalCommonGenerator).ConfigName);
          if (check_all) goto LAB_0040b62a;
        }
        if (bVar3 == false) goto LAB_0040b678;
      }
      else if ((char)local_13c != '\0') goto LAB_0040b615;
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&doc,local_138,this_00);
      std::__cxx11::string::append((char *)&doc);
      std::__cxx11::string::append((char *)&doc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&doc);
      std::__cxx11::string::~string((string *)&doc);
    }
LAB_0040b678:
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += "/";
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator l = targets.begin();
       l != targets.end(); ++l) {
    cmGeneratorTarget* gtarget = *l;
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(tname);
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  std::vector<cmStateSnapshot> children = lg->GetStateSnapshot().GetChildren();
  for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
       ci != children.end(); ++ci) {
    std::string subdir = ci->GetDirectory().GetCurrentBinary();
    subdir += "/";
    subdir += pass;
    depends.push_back(subdir);
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && this->EmptyRuleHackDepends != "") {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc = "Convenience name for \"";
  doc += pass;
  doc += "\" pass in the directory.";
  std::vector<std::string> no_commands;
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                    no_commands, true);
}